

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__chld(uv_signal_t *handle,int signum)

{
  uint uVar1;
  uv_loop_t *puVar2;
  long *plVar3;
  long lVar4;
  void *pvVar5;
  __pid_t _Var6;
  int *piVar7;
  long *plVar8;
  uint uVar9;
  int status;
  QUEUE pending;
  
  if (signum != 0x11) {
    __assert_fail("signum == SIGCHLD","src/unix/process.c",0x3e,"void uv__chld(uv_signal_t *, int)")
    ;
  }
  puVar2 = handle->loop;
  plVar3 = (long *)puVar2->process_handles[0][0];
  pending[0] = pending;
  pending[1] = pending;
LAB_0010d717:
  do {
    plVar8 = plVar3;
    if ((void *(*) [2])plVar8 == puVar2->process_handles) {
      while (pvVar5 = pending[0], pending != (void **)pending[0]) {
        lVar4 = *pending[0];
        **(long **)((long)pending[0] + 8) = lVar4;
        *(undefined8 *)(lVar4 + 8) = *(undefined8 *)((long)pending[0] + 8);
        *(void **)pending[0] = pending[0];
        *(void **)((long)pvVar5 + 8) = pvVar5;
        uVar1 = *(uint *)((long)pvVar5 + -0x20);
        if (((uVar1 >> 0xe & 1) != 0) &&
           (*(uint *)((long)pvVar5 + -0x20) = uVar1 & 0xffffbfff, (uVar1 >> 0xd & 1) != 0)) {
          piVar7 = (int *)(*(long *)((long)pvVar5 + -0x40) + 8);
          *piVar7 = *piVar7 + -1;
        }
        if (*(code **)((long)pvVar5 + -0x10) != (code *)0x0) {
          uVar9 = *(uint *)((long)pvVar5 + 0x10) & 0x7f;
          uVar1 = *(uint *)((long)pvVar5 + 0x10) >> 8 & 0xff;
          if (uVar9 != 0) {
            uVar1 = 0;
          }
          if ((int)(uVar9 * 0x1000000 + 0x1000000) < 0x2000000) {
            uVar9 = 0;
          }
          (**(code **)((long)pvVar5 + -0x10))((long)pvVar5 + -0x50,uVar1,uVar9);
        }
      }
      return;
    }
    plVar3 = (long *)*plVar8;
    do {
      _Var6 = waitpid((__pid_t)plVar8[-1],&status,1);
      if (_Var6 != -1) {
        if (_Var6 != 0) {
          *(int *)(plVar8 + 2) = status;
          lVar4 = *plVar8;
          *(long *)plVar8[1] = lVar4;
          *(long *)(lVar4 + 8) = plVar8[1];
          *plVar8 = (long)pending;
          plVar8[1] = (long)pending[1];
          *(long **)pending[1] = plVar8;
          pending[1] = plVar8;
        }
        goto LAB_0010d717;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    if (*piVar7 != 10) {
      abort();
    }
  } while( true );
}

Assistant:

static void uv__chld(uv_signal_t* handle, int signum) {
  uv_process_t* process;
  uv_loop_t* loop;
  int exit_status;
  int term_signal;
  unsigned int i;
  int status;
  pid_t pid;
  QUEUE pending;
  QUEUE* h;
  QUEUE* q;

  assert(signum == SIGCHLD);

  QUEUE_INIT(&pending);
  loop = handle->loop;

  for (i = 0; i < ARRAY_SIZE(loop->process_handles); i++) {
    h = loop->process_handles + i;
    q = QUEUE_HEAD(h);

    while (q != h) {
      process = QUEUE_DATA(q, uv_process_t, queue);
      q = QUEUE_NEXT(q);

      do
        pid = waitpid(process->pid, &status, WNOHANG);
      while (pid == -1 && errno == EINTR);

      if (pid == 0)
        continue;

      if (pid == -1) {
        if (errno != ECHILD)
          abort();
        continue;
      }

      process->status = status;
      QUEUE_REMOVE(&process->queue);
      QUEUE_INSERT_TAIL(&pending, &process->queue);
    }

    while (!QUEUE_EMPTY(&pending)) {
      q = QUEUE_HEAD(&pending);
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);

      process = QUEUE_DATA(q, uv_process_t, queue);
      uv__handle_stop(process);

      if (process->exit_cb == NULL)
        continue;

      exit_status = 0;
      if (WIFEXITED(process->status))
        exit_status = WEXITSTATUS(process->status);

      term_signal = 0;
      if (WIFSIGNALED(process->status))
        term_signal = WTERMSIG(process->status);

      process->exit_cb(process, exit_status, term_signal);
    }
  }
}